

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::start_checking(torrent *this)

{
  uint uVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  file_storage *this_00;
  undefined4 extraout_var_01;
  int iVar12;
  piece_index_t index;
  element_type *peVar13;
  vector<sha256_hash> hashes;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> local_c8;
  int local_a8;
  int local_a4;
  int local_a0;
  uint local_9c;
  undefined1 local_98 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  pointer local_88;
  pointer pdStack_80;
  pointer local_78;
  long *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *local_48;
  long *local_40;
  pointer local_38;
  
  iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_98 = (undefined1  [8])(CONCAT44(extraout_var,iVar9) + 0x438);
  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((ulong)p_Stack_90 & 0xffffffffffffff00);
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_98);
  p_Stack_90._0_1_ = true;
  iVar9 = *(int *)(CONCAT44(extraout_var,iVar9) + 0x340);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_98);
  uVar1 = (((this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length;
  uVar10 = 0x4000;
  if (uVar1 < 0x4000) {
    uVar10 = uVar1;
  }
  if ((int)uVar1 < 1) {
    uVar10 = 0x4000;
  }
  iVar12 = (int)(uVar10 * iVar9) / (int)uVar1;
  iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_98 = (undefined1  [8])(CONCAT44(extraout_var_00,iVar9) + 0x438);
  p_Stack_90._0_1_ = false;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_98);
  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(p_Stack_90._1_7_,1);
  iVar9 = *(int *)(CONCAT44(extraout_var_00,iVar9) + 0x33c);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_98);
  iVar11 = 1;
  if (1 < iVar9) {
    iVar11 = iVar9;
  }
  local_a8 = iVar11 * 2;
  if (iVar11 * 2 < iVar12) {
    local_a8 = iVar12;
  }
  iVar9 = (this->m_checking_piece).m_val;
  local_a8 = ((this->m_num_checked_pieces).m_val - iVar9) + local_a8;
  if (0 < local_a8) {
    if (iVar9 < (((this->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_files).m_num_pieces) {
      local_48 = (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<libtorrent::aux::torrent>;
      iVar9 = 0;
      do {
        peVar13 = (this->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        index.m_val = (this->m_checking_piece).m_val;
        if ((this->super_torrent_hot_members).m_picker._M_t.
            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
            (piece_picker *)0x0) {
          while (index.m_val < (peVar13->m_files).m_num_pieces) {
            bVar7 = piece_picker::have_piece
                              ((this->super_torrent_hot_members).m_picker._M_t.
                               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                               _M_head_impl,index);
            peVar13 = (this->super_torrent_hot_members).m_torrent_file.
                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            index.m_val = (this->m_checking_piece).m_val;
            if (!bVar7) break;
            index.m_val = index.m_val + 1;
            (this->m_checking_piece).m_val = index.m_val;
            (this->m_num_checked_pieces).m_val = (this->m_num_checked_pieces).m_val + 1;
          }
        }
        if ((peVar13->m_files).m_num_pieces <= index.m_val) {
LAB_00312915:
          (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x1f])();
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"start_checking, m_checking_piece: %d",
                     (ulong)(uint)(this->m_checking_piece).m_val);
          return;
        }
        bVar7 = digest32<160L>::is_all_zeros(&(peVar13->m_info_hash).v1);
        local_c8.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar8 = digest32<256L>::is_all_zeros
                          (&(((this->super_torrent_hot_members).m_torrent_file.
                              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_info_hash).v2);
        if (!bVar8) {
          this_00 = torrent_info::orig_files
                              ((this->super_torrent_hot_members).m_torrent_file.
                               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
          iVar11 = file_storage::blocks_in_piece2
                             (this_00,(piece_index_t)(this->m_checking_piece).m_val);
          ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
          resize(&local_c8,(long)iVar11);
        }
        pdVar3 = local_c8.
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pdVar2 = local_c8.
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar11 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[4])();
        local_40 = (long *)CONCAT44(extraout_var_01,iVar11);
        local_38 = pdVar2;
        local_9c = (this->m_storage).m_idx.m_val;
        local_a0 = (this->m_checking_piece).m_val;
        local_a4 = iVar9;
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_98,
                   local_48);
        pdVar5 = local_c8.
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pdVar4 = local_c8.
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pdVar2 = local_c8.
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_88 = local_c8.
                   super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pdStack_80 = local_c8.
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        local_78 = local_c8.
                   super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_c8.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68 = (long *)0x0;
        uStack_60 = 0;
        local_58 = (code *)0x0;
        pcStack_50 = (code *)0x0;
        local_68 = (long *)operator_new(0x28);
        p_Var6 = p_Stack_90;
        p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *local_68 = (long)local_98;
        local_68[1] = (long)p_Var6;
        local_98 = (undefined1  [8])0x0;
        local_68[2] = (long)pdVar2;
        local_68[3] = (long)pdVar4;
        local_68[4] = (long)pdVar5;
        local_78 = (pointer)0x0;
        local_88 = (pointer)0x0;
        pdStack_80 = (pointer)0x0;
        pcStack_50 = ::std::
                     _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2455:7)>
                     ::_M_invoke;
        local_58 = ::std::
                   _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2455:7)>
                   ::_M_manager;
        (**(code **)(*local_40 + 0x20))
                  (local_40,local_9c,local_a0,local_38,(long)pdVar3 - (long)local_38 >> 5,
                   !bVar7 << 5 | 0x18,&local_68);
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,3);
        }
        if (local_88 != (pointer)0x0) {
          operator_delete(local_88,(long)local_78 - (long)local_88);
        }
        if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
        }
        iVar11 = (this->m_checking_piece).m_val + 1;
        (this->m_checking_piece).m_val = iVar11;
        iVar9 = (((this->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_files).m_num_pieces;
        if (local_c8.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.
                          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.
                                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.
                                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((iVar9 <= iVar11) || (iVar9 = local_a4 + 1, iVar9 == local_a8)) goto LAB_00312915;
      } while( true );
    }
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"start_checking, checking_piece >= num_pieces. %d >= %d");
  }
  return;
}

Assistant:

void torrent::start_checking() try
	{
		TORRENT_ASSERT(should_check_files());

		int num_outstanding = settings().get_int(settings_pack::checking_mem_usage) * block_size()
			/ m_torrent_file->piece_length();
		// if we only keep a single read operation in-flight at a time, we suffer
		// significant performance degradation. Always keep at least 4 jobs
		// outstanding per hasher thread
		int const min_outstanding
			= std::max(1, settings().get_int(settings_pack::hashing_threads)) * 2;
		if (num_outstanding < min_outstanding) num_outstanding = min_outstanding;

		// subtract the number of pieces we already have outstanding
		num_outstanding -= (static_cast<int>(m_checking_piece)
			- static_cast<int>(m_num_checked_pieces));
		if (num_outstanding <= 0) return;

		// we might already have some outstanding jobs, if we were paused and
		// resumed quickly, before the outstanding jobs completed
		if (m_checking_piece >= m_torrent_file->end_piece())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("start_checking, checking_piece >= num_pieces. %d >= %d"
				, static_cast<int>(m_checking_piece), m_torrent_file->num_pieces());
#endif
			return;
		}

		for (int i = 0; i < num_outstanding; ++i)
		{
			if (has_picker())
			{
				// skip pieces we already have
				while (m_checking_piece < m_torrent_file->end_piece()
					&& m_picker->have_piece(m_checking_piece))
				{
					++m_checking_piece;
					++m_num_checked_pieces;
				}
			}

			if (m_checking_piece >= m_torrent_file->end_piece()) break;

			auto flags = disk_interface::sequential_access | disk_interface::volatile_read;
			if (torrent_file().info_hashes().has_v1())
				flags |= disk_interface::v1_hash;
			aux::vector<sha256_hash> hashes;
			if (torrent_file().info_hashes().has_v2())
				hashes.resize(torrent_file().orig_files().blocks_in_piece2(m_checking_piece));

			span<sha256_hash> v2_span(hashes);
			m_ses.disk_thread().async_hash(m_storage, m_checking_piece, v2_span, flags
				, [self = shared_from_this(), hashes1 = std::move(hashes)]
				(piece_index_t p, sha1_hash const& h, storage_error const& error) mutable
				{ self->on_piece_hashed(std::move(hashes1), p, h, error); });
			++m_checking_piece;
			if (m_checking_piece >= m_torrent_file->end_piece()) break;
		}
		m_ses.deferred_submit_jobs();
#ifndef TORRENT_DISABLE_LOGGING
		debug_log("start_checking, m_checking_piece: %d"
			, static_cast<int>(m_checking_piece));
#endif
	}
	catch (...) { handle_exception(); }